

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int init(EVP_PKEY_CTX *ctx)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int i;
  int iVar4;
  int extraout_EAX;
  FILE *pFVar5;
  long lVar6;
  uint *puVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  uint *puVar11;
  int (*paiVar12) [60];
  long lVar13;
  int (*paiVar14) [60];
  uint v;
  uint u;
  uint value;
  bool bucket [280005];
  uint uStack_44604;
  uint uStack_44600;
  undefined1 auStack_445fc [4];
  char acStack_445f8 [280008];
  
  pFVar5 = fopen(*(char **)ctx,"r");
  iVar4 = __isoc99_fscanf(pFVar5,"%u,%u,%u",&uStack_44600,&uStack_44604,auStack_445fc);
  if (iVar4 != -1) {
    do {
      lVar6 = (long)inputNum;
      inputs[lVar6] = uStack_44600;
      inputNum = inputNum + 2;
      inputs[lVar6 + 1] = uStack_44604;
      iVar4 = __isoc99_fscanf(pFVar5,"%u,%u,%u",&uStack_44600,&uStack_44604,auStack_445fc);
    } while (iVar4 != -1);
  }
  puVar11 = ids;
  memcpy(ids,inputs,0x222e28);
  lVar6 = (long)inputNum;
  memset(acStack_445f8,0,0x445c5);
  if (0 < lVar6) {
    puVar7 = ids;
    do {
      acStack_445f8[*puVar7] = '\x01';
      puVar7 = puVar7 + 1;
    } while (puVar7 < ids + lVar6);
  }
  lVar6 = 0;
  do {
    if (acStack_445f8[lVar6] == '\x01') {
      *puVar11 = (uint)lVar6;
      puVar11 = puVar11 + 1;
    }
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x445c5);
  puVar7 = ids;
  uVar10 = (uint)((ulong)(puVar11 + -0x2091280) >> 2);
  nodeNum = uVar10;
  if (0 < (int)uVar10) {
    uVar9 = 0;
    do {
      idHash[*puVar7] = (int)uVar9;
      uVar9 = uVar9 + 1;
      puVar7 = puVar7 + 1;
    } while ((uVar10 & 0x7fffffff) != uVar9);
  }
  uVar9 = (ulong)inputNum;
  if (0 < (long)uVar9) {
    uVar8 = 0;
    do {
      iVar4 = idHash[inputs[uVar8]];
      iVar1 = idHash[inputs[uVar8 + 1]];
      iVar2 = outDegrees[iVar4];
      outDegrees[iVar4] = iVar2 + 1;
      G[iVar4][iVar2] = iVar1;
      iVar2 = inDegrees[iVar1];
      inDegrees[iVar1] = iVar2 + 1;
      Ginv[iVar1][iVar2] = iVar4;
      uVar8 = uVar8 + 2;
    } while (uVar8 < uVar9);
  }
  if (0 < (int)uVar10) {
    paiVar12 = Ginv;
    paiVar14 = G;
    lVar13 = 0;
    lVar6 = 0;
    do {
      uVar9 = (ulong)*(int *)((long)outDegrees + lVar13);
      if (uVar9 != 0) {
        lVar3 = 0x3f;
        if (uVar9 != 0) {
          for (; uVar9 >> lVar3 == 0; lVar3 = lVar3 + -1) {
          }
        }
        std::__introsort_loop<int*,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (paiVar14,*paiVar14 + uVar9,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
        std::__final_insertion_sort<int*,__gnu_cxx::__ops::_Iter_less_iter>
                  (paiVar14,*paiVar14 + uVar9);
      }
      uVar9 = (ulong)*(int *)((long)inDegrees + lVar13);
      if (uVar9 != 0) {
        lVar3 = 0x3f;
        if (uVar9 != 0) {
          for (; uVar9 >> lVar3 == 0; lVar3 = lVar3 + -1) {
          }
        }
        std::__introsort_loop<int*,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (paiVar12,*paiVar12 + uVar9,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
        std::__final_insertion_sort<int*,__gnu_cxx::__ops::_Iter_less_iter>
                  (paiVar12,*paiVar12 + uVar9);
      }
      lVar6 = lVar6 + 1;
      lVar13 = lVar13 + 4;
      paiVar12 = paiVar12 + 1;
      paiVar14 = paiVar14 + 1;
    } while (lVar6 < nodeNum);
  }
  std::
  vector<std::unordered_map<int,_std::vector<int,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::unordered_map<int,_std::vector<int,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>
  ::resize(&pre,0x445c5);
  return extraout_EAX;
}

Assistant:

void run() {
    int path[16];
    for (int i = 0; i < nodeNum; ++i) {
        if (outDegrees[i] < 1 || inDegrees[i] < 1)continue;
        dfs_range1(i, i, 1);
        dfs_range2(i, i, 1);
        dfs(i, i, 1, path);
    }
}